

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O2

void __thiscall OStreamTest_Join_Test::TestBody(OStreamTest_Join_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int v [3];
  undefined1 local_2c [36];
  
  local_2c._12_8_ = local_2c;
  v[0] = 1;
  v[1] = 2;
  v[2] = 3;
  local_2c._4_8_ = v;
  local_2c._20_8_ = ", ";
  local_2c._28_8_ = 2;
  fmt::v5::format<char[3],fmt::v5::arg_join<int*,char>>
            (&local_58,(v5 *)"{}",(char (*) [3])(local_2c + 4),
             (arg_join<int_*,_char> *)local_2c._12_8_);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"1, 2, 3\"","fmt::format(\"{}\", fmt::join(v, v + 3, \", \"))",
             (char (*) [8])"1, 2, 3",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_2c + 4),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/ostream-test.cc"
               ,0xa4,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_2c + 4),(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_2c + 4));
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(OStreamTest, Join) {
  int v[3] = {1, 2, 3};
  EXPECT_EQ("1, 2, 3", fmt::format("{}", fmt::join(v, v + 3, ", ")));
}